

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_subgraph.cc
# Opt level: O0

CommonSubgraphResult *
gss::solve_common_subgraph_problem
          (InputGraph *first,InputGraph *second,CommonSubgraphParams *params)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  optional<int> d;
  bool bVar1;
  int iVar4;
  int iVar5;
  undefined8 uVar7;
  bool bVar2;
  undefined1 uVar3;
  uint uVar6;
  ulong uVar8;
  size_type sVar9;
  ulong uVar10;
  type_conflict3 *ptVar11;
  type_conflict3 *ptVar12;
  type_conflict3 *ptVar13;
  type_conflict3 *ptVar14;
  reference piVar15;
  long in_RCX;
  undefined8 in_RDX;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_RSI;
  CommonSubgraphResult *in_RDI;
  string_view sVar16;
  string_view sVar17;
  string_view sVar18;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar19;
  bool in_stack_0000017f;
  vector<int,_std::allocator<int>_> *in_stack_00000180;
  vector<int,_std::allocator<int>_> *in_stack_00000188;
  int in_stack_00000194;
  int in_stack_00000198;
  int in_stack_0000019c;
  Proof *in_stack_000001a0;
  CommonSubgraphRunner runner;
  int *m;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  CliqueResult clique_result;
  bool edge;
  type_conflict3 *ws;
  type_conflict3 *wf;
  type_conflict3 *vs;
  type_conflict3 *vf;
  uint w_2;
  uint v_2;
  int w_1;
  int v_1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> zero_in_proof_objectives;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> assoc_encoding;
  InputGraph assoc;
  CliqueParams clique_params;
  int w;
  int v;
  vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  solution;
  int u;
  vector<int,_std::allocator<int>_> permitted;
  int q;
  int t;
  int p;
  int n;
  shared_ptr<gss::innards::Proof> proof;
  CommonSubgraphResult *result;
  CliqueParams *in_stack_00000e20;
  InputGraph *in_stack_00000e28;
  int in_stack_fffffffffffff978;
  int in_stack_fffffffffffff97c;
  CliqueParams *in_stack_fffffffffffff980;
  pair<int,_int> *in_stack_fffffffffffff988;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x_02;
  undefined7 in_stack_fffffffffffff990;
  undefined1 in_stack_fffffffffffff997;
  int in_stack_fffffffffffff998;
  int in_stack_fffffffffffff99c;
  undefined4 in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a4;
  ProofOptions *in_stack_fffffffffffff9a8;
  allocator<char> *in_stack_fffffffffffff9b0;
  char *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  int in_stack_fffffffffffff9c8;
  undefined2 uVar20;
  int in_stack_fffffffffffff9cc;
  InputGraph *in_stack_fffffffffffff9d0;
  char *in_stack_fffffffffffff9e0;
  vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
  *in_stack_fffffffffffff9e8;
  Proof *in_stack_fffffffffffff9f0;
  size_t in_stack_fffffffffffff9f8;
  uint in_stack_fffffffffffffa00;
  undefined2 in_stack_fffffffffffffa04;
  undefined1 in_stack_fffffffffffffa06;
  undefined1 in_stack_fffffffffffffa07;
  int in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa24;
  Proof *in_stack_fffffffffffffa28;
  _Storage<int,_true> in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  Proof *in_stack_fffffffffffffb90;
  _Self local_468;
  _Self local_460;
  undefined1 *local_458;
  undefined1 local_449;
  undefined1 local_448 [48];
  unsigned_long_long local_418;
  byte local_3e8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_3e0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *local_3d8;
  size_t local_3d0;
  undefined8 in_stack_fffffffffffffc38;
  Proof *in_stack_fffffffffffffc40;
  uint local_378;
  uint local_374;
  int local_350;
  int local_34c;
  CommonSubgraphRunner *in_stack_fffffffffffffcb8;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_330;
  int local_30c;
  _Optional_payload_base<int> local_308;
  undefined8 local_2e8;
  undefined8 local_2e0;
  _Optional_payload_base<int> local_234;
  undefined1 local_221;
  int local_190;
  int local_18c;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *local_170;
  undefined1 local_148 [16];
  undefined8 local_138;
  int local_128;
  int local_124;
  int local_104;
  string_view local_100;
  string_view local_f0;
  int local_e0;
  int local_dc;
  undefined8 local_d0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *target_name;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  Proof *in_stack_ffffffffffffff70;
  int local_7c;
  __shared_ptr local_68 [19];
  undefined1 local_55;
  long local_20;
  undefined8 local_18;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
  *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((*(byte *)(in_RCX + 0x20) & 1) != 0) &&
     (bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x1273fd), !bVar1)) {
    local_55 = 1;
    uVar7 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
    UnsupportedConfiguration::UnsupportedConfiguration
              ((UnsupportedConfiguration *)in_stack_fffffffffffff980,
               (string *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_55 = 0;
    __cxa_throw(uVar7,&UnsupportedConfiguration::typeinfo,
                UnsupportedConfiguration::~UnsupportedConfiguration);
  }
  std::shared_ptr<gss::innards::Proof>::shared_ptr((shared_ptr<gss::innards::Proof> *)0x1274fe);
  bVar1 = std::optional::operator_cast_to_bool((optional<gss::ProofOptions> *)0x12750f);
  if (bVar1) {
    std::optional<gss::ProofOptions>::operator*((optional<gss::ProofOptions> *)0x127529);
    std::make_shared<gss::innards::Proof,gss::ProofOptions_const&>(in_stack_fffffffffffff9a8);
    std::shared_ptr<gss::innards::Proof>::operator=
              ((shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffff980,
               (shared_ptr<gss::innards::Proof> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x12755d);
    for (local_7c = 0; iVar5 = InputGraph::size((InputGraph *)0x127583), local_7c < iVar5;
        local_7c = local_7c + 1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1275af);
      InputGraph::size((InputGraph *)0x1275d2);
      target_name = local_10;
      std::function<std::__cxx11::string(int)>::
      function<gss::solve_common_subgraph_problem(InputGraph_const&,InputGraph_const&,gss::CommonSubgraphParams_const&)::__0,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                 (anon_class_8_1_a7e8c1d0 *)in_stack_fffffffffffff988);
      local_d0 = local_18;
      std::function<std::__cxx11::string(int)>::
      function<gss::solve_common_subgraph_problem(InputGraph_const&,InputGraph_const&,gss::CommonSubgraphParams_const&)::__1,void>
                ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                 (anon_class_8_1_6b1f35b2 *)in_stack_fffffffffffff988);
      innards::Proof::create_cp_variable
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff60,target_name);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                   *)0x12767f);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                   *)0x12768c);
    }
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1276fb);
    InputGraph::size((InputGraph *)0x127710);
    InputGraph::size((InputGraph *)0x127726);
    std::optional<int>::optional<unsigned_int,_true>
              ((optional<int> *)in_stack_fffffffffffff980,
               (optional<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
         in_stack_fffffffffffffa34;
    d.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._M_payload.
    _M_value = in_stack_fffffffffffffa30._M_value;
    innards::Proof::create_null_decision_bound
              (in_stack_fffffffffffffa28,in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,d);
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x12777a);
    InputGraph::size((InputGraph *)0x12778f);
    InputGraph::size((InputGraph *)0x1277a5);
    innards::Proof::create_injectivity_constraints
              (in_stack_fffffffffffffc40,(int)((ulong)in_stack_fffffffffffffc38 >> 0x20),
               (int)in_stack_fffffffffffffc38);
    local_dc = 0;
    while( true ) {
      iVar5 = local_dc;
      iVar4 = InputGraph::size((InputGraph *)0x1277f1);
      if (iVar4 <= iVar5) break;
      local_e0 = 0;
      while( true ) {
        iVar5 = local_e0;
        iVar4 = InputGraph::size((InputGraph *)0x127836);
        if (iVar4 <= iVar5) break;
        bVar1 = InputGraph::adjacent
                          ((InputGraph *)
                           CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                           (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                           (int)in_stack_fffffffffffff988);
        bVar2 = InputGraph::adjacent
                          ((InputGraph *)
                           CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                           (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                           (int)in_stack_fffffffffffff988);
        if (bVar1 == bVar2) {
          sVar17 = InputGraph::vertex_label
                             ((InputGraph *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
          local_f0 = sVar17;
          sVar17 = InputGraph::vertex_label
                             ((InputGraph *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
          __x._M_str = (char *)in_stack_fffffffffffff9b0;
          __x._M_len = (size_t)in_stack_fffffffffffff9a8;
          __y._M_len._4_4_ = in_stack_fffffffffffff99c;
          __y._M_len._0_4_ = in_stack_fffffffffffff998;
          __y._M_str._0_4_ = in_stack_fffffffffffff9a0;
          __y._M_str._4_4_ = in_stack_fffffffffffff9a4;
          local_100 = sVar17;
          bVar1 = std::operator==(__x,__y);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1279d9);
            innards::Proof::start_adjacency_constraints_for
                      ((Proof *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c,
                       in_stack_fffffffffffff978);
            local_104 = 0;
            while( true ) {
              iVar5 = local_104;
              iVar4 = InputGraph::size((InputGraph *)0x127a17);
              if (iVar4 <= iVar5) break;
              if (local_104 != local_dc) {
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)0x127a57);
                local_124 = 0;
                while( true ) {
                  iVar5 = local_124;
                  iVar4 = InputGraph::size((InputGraph *)0x127a7d);
                  if (iVar4 <= iVar5) break;
                  if (local_e0 != local_124) {
                    bVar1 = InputGraph::adjacent
                                      ((InputGraph *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                                       (int)in_stack_fffffffffffff988);
                    bVar2 = InputGraph::adjacent
                                      ((InputGraph *)
                                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
                                       ,(int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                                       (int)in_stack_fffffffffffff988);
                    if (bVar1 == bVar2) {
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                                 &in_stack_fffffffffffff988->first);
                    }
                  }
                  local_124 = local_124 + 1;
                }
                local_128 = InputGraph::size((InputGraph *)0x127b7b);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff980,
                           (value_type_conflict1 *)
                           CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
                std::
                __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x127bb6);
                local_148 = (undefined1  [16])0x0;
                local_138 = 0;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)0x127c16);
                in_stack_fffffffffffff978 = 0;
                innards::Proof::create_adjacency_constraint
                          (in_stack_000001a0,in_stack_0000019c,in_stack_00000198,in_stack_00000194,
                           in_stack_00000188,in_stack_00000180,in_stack_0000017f);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
              }
              local_104 = local_104 + 1;
            }
          }
          else {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1279af);
            innards::Proof::create_forbidden_assignment_constraint
                      ((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                       in_stack_fffffffffffff9c8);
          }
        }
        else {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1278cc);
          innards::Proof::create_forbidden_assignment_constraint
                    ((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                     in_stack_fffffffffffff9c8);
        }
        local_e0 = local_e0 + 1;
      }
      local_dc = local_dc + 1;
    }
    if ((*(byte *)(local_20 + 0x98) & 1) != 0) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x127d10);
      InputGraph::size((InputGraph *)0x127d25);
      InputGraph::size((InputGraph *)0x127d3b);
      local_170 = local_10;
      std::function<bool(int,int)>::
      function<gss::solve_common_subgraph_problem(InputGraph_const&,InputGraph_const&,gss::CommonSubgraphParams_const&)::__2,void>
                ((function<bool_(int,_int)> *)
                 CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                 (anon_class_8_1_a7e8c1d0 *)in_stack_fffffffffffff988);
      innards::Proof::create_connected_constraints
                ((Proof *)clique_result._96_8_,
                 clique_result.extra_stats.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node._M_size._4_4_,
                 (int)clique_result.extra_stats.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl._M_node._M_size,
                 (function<bool_(int,_int)> *)
                 clique_result.extra_stats.
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev);
      std::function<bool_(int,_int)>::~function((function<bool_(int,_int)> *)0x127da3);
    }
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x127dd8);
    innards::Proof::finalise_model(in_stack_fffffffffffffb90);
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0x127df3);
    if (!bVar1) {
      std::
      vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ::vector((vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                *)0x127e08);
      local_18c = 0;
      while( true ) {
        iVar5 = local_18c;
        iVar4 = InputGraph::size((InputGraph *)0x127e2e);
        if (iVar4 <= iVar5) break;
        local_190 = 0;
        while( true ) {
          iVar5 = local_190;
          iVar4 = InputGraph::size((InputGraph *)0x127e73);
          if (iVar4 <= iVar5) break;
          InputGraph::vertex_name_abi_cxx11_
                    ((InputGraph *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff980,
                     (int *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x127ecd);
          InputGraph::vertex_name_abi_cxx11_
                    ((InputGraph *)in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a4);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff980,
                     (int *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x127f0a);
          local_221 = 0;
          std::
          vector<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>,std::allocator<std::tuple<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>>>
          ::
          emplace_back<std::pair<int,std::__cxx11::string>,std::pair<int,std::__cxx11::string>,bool>
                    ((vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
                     (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                     (bool *)in_stack_fffffffffffff988);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x127f48);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff980);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x127f62);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff980);
          local_190 = local_190 + 1;
        }
        local_18c = local_18c + 1;
      }
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x128052);
      innards::Proof::new_incumbent(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x128071);
      InputGraph::size((InputGraph *)0x128086);
      innards::Proof::rewrite_mcs_objective
                ((Proof *)CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 in_stack_fffffffffffff99c);
      std::
      vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
      ::~vector((vector<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>,_std::allocator<std::tuple<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>_>_>
                 *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    }
  }
  uVar20 = (undefined2)((uint)in_stack_fffffffffffff9c8 >> 0x10);
  if ((*(byte *)(local_20 + 0x99) & 1) == 0) {
    anon_unknown.dwarf_54df9::CommonSubgraphRunner::CommonSubgraphRunner
              ((CommonSubgraphRunner *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990)
               ,(InputGraph *)in_stack_fffffffffffff988,(InputGraph *)in_stack_fffffffffffff980,
               (CommonSubgraphParams *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978)
               ,(shared_ptr<gss::innards::Proof> *)0x128a99);
    anon_unknown.dwarf_54df9::CommonSubgraphRunner::run(in_stack_fffffffffffffcb8);
    anon_unknown.dwarf_54df9::CommonSubgraphRunner::~CommonSubgraphRunner
              ((CommonSubgraphRunner *)0x128aca);
  }
  else {
    CliqueParams::CliqueParams
              ((CliqueParams *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::shared_ptr<gss::Timeout>::operator=
              (&in_stack_fffffffffffff980->timeout,
               (shared_ptr<gss::Timeout> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_2e8 = *(undefined8 *)(local_20 + 0x10);
    local_2e0 = *(undefined8 *)(local_20 + 0x18);
    std::make_unique<gss::NoRestartsSchedule>();
    std::unique_ptr<gss::RestartsSchedule,std::default_delete<gss::RestartsSchedule>>::operator=
              ((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
               (unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_> *
               )in_stack_fffffffffffff988);
    std::unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>::
    ~unique_ptr((unique_ptr<gss::NoRestartsSchedule,_std::default_delete<gss::NoRestartsSchedule>_>
                 *)in_stack_fffffffffffff980);
    local_30c = InputGraph::size((InputGraph *)0x12816f);
    local_308 = (_Optional_payload_base<int>)
                std::make_optional<int>
                          ((int *)CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_234 = local_308;
    InputGraph::InputGraph
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,SUB21((ushort)uVar20 >> 8,0),
               SUB21(uVar20,0));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1281cd);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1281da);
    sVar16._M_str = (char *)in_stack_fffffffffffff9f0;
    sVar16._M_len = in_stack_fffffffffffff9f8;
    sVar17._M_str = in_stack_fffffffffffff9e0;
    sVar17._M_len = (size_t)in_stack_fffffffffffff9e8;
    local_34c = 0;
    while( true ) {
      iVar5 = InputGraph::size((InputGraph *)0x128200);
      if (iVar5 <= local_34c) break;
      local_350 = 0;
      while( true ) {
        iVar5 = InputGraph::size((InputGraph *)0x128245);
        if (iVar5 <= local_350) break;
        in_stack_fffffffffffffa07 =
             InputGraph::adjacent
                       ((InputGraph *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                        (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                        (int)in_stack_fffffffffffff988);
        in_stack_fffffffffffffa00 = (uint)(byte)in_stack_fffffffffffffa07;
        in_stack_fffffffffffffa06 =
             InputGraph::adjacent
                       ((InputGraph *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                        (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                        (int)in_stack_fffffffffffff988);
        if (in_stack_fffffffffffffa00 == (byte)in_stack_fffffffffffffa06) {
          sVar16 = InputGraph::vertex_label
                             ((InputGraph *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
          sVar17 = InputGraph::vertex_label
                             ((InputGraph *)in_stack_fffffffffffff980,in_stack_fffffffffffff97c);
          __x_00._M_str = (char *)in_stack_fffffffffffff9b0;
          __x_00._M_len = (size_t)in_stack_fffffffffffff9a8;
          __y_00._M_len._4_4_ = in_stack_fffffffffffff99c;
          __y_00._M_len._0_4_ = in_stack_fffffffffffff998;
          __y_00._M_str._0_4_ = in_stack_fffffffffffff9a0;
          __y_00._M_str._4_4_ = in_stack_fffffffffffff9a4;
          bVar1 = std::operator==(__x_00,__y_00);
          if (!bVar1) goto LAB_001283ca;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int&,int&>
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                     &in_stack_fffffffffffff988->first,(int *)in_stack_fffffffffffff980);
        }
        else {
LAB_001283ca:
          bVar1 = std::__shared_ptr::operator_cast_to_bool(local_68);
          if (bVar1) {
            std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
            emplace_back<int&,int&>
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                       &in_stack_fffffffffffff988->first,(int *)in_stack_fffffffffffff980);
          }
        }
        local_350 = local_350 + 1;
      }
      local_34c = local_34c + 1;
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_68);
    if (bVar1) {
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x128450);
      innards::Proof::create_clique_encoding
                ((Proof *)CONCAT17(in_stack_fffffffffffffa07,
                                   CONCAT16(in_stack_fffffffffffffa06,
                                            CONCAT24(in_stack_fffffffffffffa04,
                                                     in_stack_fffffffffffffa00))),
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)sVar16._M_len
                 ,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                  sVar16._M_str);
    }
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size(&local_330);
    InputGraph::resize((InputGraph *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                       (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
    sVar18._M_str = (char *)in_stack_fffffffffffff9b0;
    sVar18._M_len = (size_t)in_stack_fffffffffffff9b8;
    local_374 = 0;
    while( true ) {
      uVar8 = (ulong)local_374;
      sVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        (&local_330);
      if (sVar9 <= uVar8) break;
      local_378 = 0;
      while( true ) {
        uVar10 = (ulong)local_378;
        sVar9 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                          (&local_330);
        if (sVar9 <= uVar10) break;
        if (local_374 != local_378) {
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (&local_330,(ulong)local_374);
          ptVar11 = std::get<0ul,int,int>((pair<int,_int> *)0x128536);
          ptVar12 = std::get<1ul,int,int>((pair<int,_int> *)0x12854b);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                    (&local_330,(ulong)local_378);
          ptVar13 = std::get<0ul,int,int>((pair<int,_int> *)0x128581);
          ptVar14 = std::get<1ul,int,int>((pair<int,_int> *)0x128596);
          bVar1 = false;
          if ((*ptVar11 != *ptVar13) && (*ptVar12 != *ptVar14)) {
            bVar2 = InputGraph::adjacent
                              ((InputGraph *)
                               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                               (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                               (int)in_stack_fffffffffffff988);
            uVar6 = (uint)bVar2;
            bVar2 = InputGraph::adjacent
                              ((InputGraph *)
                               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                               (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                               (int)in_stack_fffffffffffff988);
            if (uVar6 == bVar2) {
              uVar3 = InputGraph::adjacent
                                ((InputGraph *)
                                 CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                                 (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                                 (int)in_stack_fffffffffffff988);
              if ((bool)uVar3) {
                sVar18 = InputGraph::edge_label
                                   ((InputGraph *)
                                    CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                                    in_stack_fffffffffffff99c,in_stack_fffffffffffff998);
                sVar16 = InputGraph::edge_label
                                   ((InputGraph *)
                                    CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                                    in_stack_fffffffffffff99c,in_stack_fffffffffffff998);
                local_3d0 = sVar16._M_len;
                in_stack_fffffffffffff9a0 = sVar16._M_str._0_4_;
                in_stack_fffffffffffff9a4 = sVar16._M_str._4_4_;
                __x_01._M_str = sVar18._M_str;
                __x_01._M_len = local_3d0;
                __y_01._M_len._4_4_ = in_stack_fffffffffffff99c;
                __y_01._M_len._0_4_ = in_stack_fffffffffffff998;
                __y_01._M_str._0_4_ = in_stack_fffffffffffff9a0;
                __y_01._M_str._4_4_ = in_stack_fffffffffffff9a4;
                bVar2 = std::operator==(__x_01,__y_01);
                if (!bVar2) goto LAB_00128762;
              }
              bVar1 = true;
              InputGraph::add_edge
                        ((InputGraph *)CONCAT17(uVar3,in_stack_fffffffffffff9c0),sVar18._M_len._4_4_
                         ,(int)sVar18._M_len);
            }
          }
LAB_00128762:
          bVar2 = std::__shared_ptr::operator_cast_to_bool(local_68);
          if ((bVar2) && (!bVar1)) {
            std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12878c);
            innards::Proof::create_clique_nonedge
                      ((Proof *)sVar17._M_str,(int)(uVar8 >> 0x20),(int)uVar8);
          }
        }
        local_378 = local_378 + 1;
      }
      local_374 = local_374 + 1;
    }
    std::shared_ptr<gss::innards::Proof>::operator=
              ((shared_ptr<gss::innards::Proof> *)in_stack_fffffffffffff980,
               (shared_ptr<gss::innards::Proof> *)
               CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    if ((*(byte *)(local_20 + 0x98) & 1) != 0) {
      local_3e0 = &local_330;
      local_3d8 = local_10;
      std::function<gss::innards::SVOBitset(int,std::function<int(int)>const&)>::operator=
                ((function<gss::innards::SVOBitset_(int,_const_std::function<int_(int)>_&)> *)
                 CONCAT44(in_stack_fffffffffffff9a4,in_stack_fffffffffffff9a0),
                 (anon_class_16_2_90fa8e9e *)
                 CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
    }
    solve_clique_problem(in_stack_00000e28,in_stack_00000e20);
    local_449 = 0;
    CommonSubgraphResult::CommonSubgraphResult((CommonSubgraphResult *)in_stack_fffffffffffff980);
    local_458 = local_448;
    local_460._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    local_468._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(in_stack_fffffffffffff97c,in_stack_fffffffffffff978));
    while( true ) {
      bVar1 = std::operator==(&local_460,&local_468);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      piVar15 = std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)0x1288d9);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                (&local_330,(long)*piVar15);
      pVar19 = std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>::
               emplace<std::pair<int,int>&>
                         ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
                          in_stack_fffffffffffff988);
      in_stack_fffffffffffff997 = pVar19.second;
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffff980);
    }
    in_RDI->nodes = local_418;
    __x_02 = &in_RDI->extra_stats;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),__x_02);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[26]>
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990),
               (char (*) [26])__x_02);
    in_RDI->complete = (bool)(local_3e8 & 1);
    local_449 = 1;
    CliqueResult::~CliqueResult((CliqueResult *)in_stack_fffffffffffff980);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_fffffffffffff997,in_stack_fffffffffffff990));
    InputGraph::~InputGraph((InputGraph *)0x128a21);
    CliqueParams::~CliqueParams(in_stack_fffffffffffff980);
  }
  std::shared_ptr<gss::innards::Proof>::~shared_ptr((shared_ptr<gss::innards::Proof> *)0x128afc);
  return in_RDI;
}

Assistant:

auto gss::solve_common_subgraph_problem(const InputGraph & first, const InputGraph & second,
    const CommonSubgraphParams & params) -> CommonSubgraphResult
{
    if (params.count_solutions && ! params.decide)
        throw UnsupportedConfiguration{"Solution counting only makes sense for decision problems"};

    shared_ptr<Proof> proof;
    if (params.proof_options) {
        proof = make_shared<Proof>(*params.proof_options);

        for (int n = 0; n < first.size(); ++n) {
            proof->create_cp_variable(
                n, second.size() + 1,
                [&](int v) { return first.vertex_name(v); },
                [&](int v) { if (v == second.size()) return string("null"); else return second.vertex_name(v); });
        }

        proof->create_null_decision_bound(first.size(), second.size(), params.decide);

        // generate constraints for injectivity
        proof->create_injectivity_constraints(first.size(), second.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < first.size(); ++p) {
            for (int t = 0; t < second.size(); ++t) {
                if (first.adjacent(p, p) != second.adjacent(t, t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else if (first.vertex_label(p) != second.vertex_label(t))
                    proof->create_forbidden_assignment_constraint(p, t);
                else {
                    proof->start_adjacency_constraints_for(p, t);

                    // if p can be mapped to t, then each (non-)neighbour of p...
                    for (int q = 0; q < first.size(); ++q)
                        if (q != p) {
                            // ... must be mapped to a (non-)neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < second.size(); ++u)
                                if (t != u && first.adjacent(p, q) == second.adjacent(t, u))
                                    permitted.push_back(u);
                            // or null
                            permitted.push_back(second.size());
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, false);
                        }
                }
            }
        }

        if (params.connected)
            proof->create_connected_constraints(first.size(), second.size(), [&](int a, int b) { return first.adjacent(a, b); });

        // output the model file
        proof->finalise_model();

        // rewrite the objective to the form we need
        if (! params.decide) {
            vector<tuple<NamedVertex, NamedVertex, bool>> solution;
            for (int v = 0; v < first.size(); ++v)
                for (int w = 0; w < second.size(); ++w)
                    solution.emplace_back(
                        NamedVertex{v, first.vertex_name(v)},
                        NamedVertex{w, second.vertex_name(w)},
                        false);
            proof->new_incumbent(solution);
            proof->rewrite_mcs_objective(first.size());
        }
    }

    if (params.clique) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = params.decide;
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        clique_params.adjust_objective_for_mcs = make_optional(first.size());

        InputGraph assoc{0, false, false};
        vector<pair<int, int>> assoc_encoding, zero_in_proof_objectives;

        for (int v = 0; v < first.size(); ++v)
            for (int w = 0; w < second.size(); ++w)
                if ((first.adjacent(v, v) == second.adjacent(w, w)) && (first.vertex_label(v) == second.vertex_label(w)))
                    assoc_encoding.emplace_back(v, w);
                else if (proof)
                    zero_in_proof_objectives.emplace_back(v, w);

        if (proof)
            proof->create_clique_encoding(assoc_encoding, zero_in_proof_objectives);

        assoc.resize(assoc_encoding.size());
        for (unsigned v = 0; v < assoc_encoding.size(); ++v)
            for (unsigned w = 0; w < assoc_encoding.size(); ++w)
                if (v != w) {
                    auto [vf, vs] = assoc_encoding[v];
                    auto [wf, ws] = assoc_encoding[w];
                    bool edge = false;
                    if (vf != wf && vs != ws && first.adjacent(vf, wf) == second.adjacent(vs, ws)) {
                        if ((! first.adjacent(vf, wf)) || (first.edge_label(vf, wf) == second.edge_label(vs, ws))) {
                            edge = true;
                            assoc.add_edge(v, w);
                        }
                    }

                    if (proof && ! edge)
                        proof->create_clique_nonedge(v, w);
                }

        clique_params.extend_proof = proof;

        if (params.connected) {
            clique_params.connected = [&](int x, const function<auto(int)->int> & invorder) -> SVOBitset {
                auto [f, _] = assoc_encoding[x];
                SVOBitset v(assoc_encoding.size(), 0);
                v.reset();
                for (unsigned y = 0; y < assoc_encoding.size(); ++y)
                    if (first.adjacent(f, assoc_encoding[y].first))
                        v.set(invorder(y));
                return v;
            };
        }

        auto clique_result = solve_clique_problem(assoc, clique_params);

        // now translate the result back into what we expect
        CommonSubgraphResult result;
        for (auto & m : clique_result.clique)
            result.mapping.emplace(assoc_encoding[m]);
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        CommonSubgraphRunner runner{first, second, params, proof};
        return runner.run();
    }
}